

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O1

Variable __thiscall LiteScript::_Type_NUMBER::OAdd(_Type_NUMBER *this,Variable *obj1,Variable *obj2)

{
  Number *pNVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  Variable tmp;
  Variable local_40;
  Number local_30;
  
  pOVar3 = Variable::operator->((Variable *)in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)obj1);
  if (bVar2) {
    Variable::Convert(&local_40,in_RCX);
    pOVar3 = Variable::operator->(&local_40);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator!=(pTVar4,(Type *)obj1);
    if (bVar2) {
      pOVar3 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    }
    else {
      pOVar3 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      pOVar3 = Variable::operator->(obj2);
      pNVar1 = (Number *)pOVar3->data;
      Variable::operator->(&local_40);
      Number::operator+(&local_30,pNVar1);
      pOVar3 = Variable::operator->((Variable *)this);
      Number::operator=((Number *)pOVar3->data,&local_30);
    }
    Variable::~Variable(&local_40);
    puVar5 = extraout_RDX_00;
  }
  else {
    pOVar3 = Variable::operator->(obj2);
    Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    pOVar3 = Variable::operator->(obj2);
    pNVar1 = (Number *)pOVar3->data;
    Variable::operator->((Variable *)in_RCX);
    Number::operator+((Number *)&local_40,pNVar1);
    pOVar3 = Variable::operator->((Variable *)this);
    Number::operator=((Number *)pOVar3->data,(Number *)&local_40);
    puVar5 = extraout_RDX;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OAdd(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != *this) {
        Variable tmp = obj2.Convert(*this);
        if (tmp->GetType() != *this)
            return obj1->memory.Create(Type::NIL);
        Variable res = obj1->memory.Create(Type::NUMBER);
        res->GetData<Number>() = obj1->GetData<Number>() + tmp->GetData<Number>();
        return res;
    }
    Variable res = obj1->memory.Create(Type::NUMBER);
    res->GetData<Number>() = obj1->GetData<Number>() + obj2->GetData<Number>();
    return res;
}